

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::color_blend_state_is_supported
          (Impl *this,VkPipelineColorBlendStateCreateInfo *info,VkDynamicState *dynamic_states,
          uint32_t num_dynamic_states)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  VkPipelineColorBlendAttachmentState *pVVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  
  if (((info->flags < 2) &&
      ((info->flags == 0 ||
       ((this->features).rasterization_order_attachment_access.
        rasterizationOrderColorAttachmentAccess != 0)))) &&
     ((bVar8 = has_dynamic_state(dynamic_states,num_dynamic_states,
                                 VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT), bVar8 ||
      ((info->logicOpEnable == 0 || ((this->features2).features.logicOp != 0)))))) {
    bVar8 = has_dynamic_state(dynamic_states,num_dynamic_states,
                              VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT);
    if (bVar8) {
      return true;
    }
    bVar8 = has_dynamic_state(dynamic_states,num_dynamic_states,
                              VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT);
    if (bVar8) {
      return true;
    }
    uVar3 = info->attachmentCount;
    bVar11 = 0;
    bVar12 = 0;
    for (lVar10 = 0; (ulong)uVar3 << 5 != lVar10; lVar10 = lVar10 + 0x20) {
      iVar4 = *(int *)((long)&info->pAttachments->colorBlendOp + lVar10);
      iVar5 = *(int *)((long)&info->pAttachments->alphaBlendOp + lVar10);
      uVar1 = iVar4 + 0xc462f3e0;
      uVar2 = iVar5 + 0xc462f3e0;
      if ((uVar1 < 0x2e || uVar2 < 0x2e) &&
         (iVar5 != iVar4 || (this->props).blend_operation_advanced.advancedBlendAllOperations == 0))
      {
        return false;
      }
      bVar11 = bVar11 | uVar2 < 0x2e;
      bVar12 = bVar12 | uVar1 < 0x2e;
    }
    if (!(bool)(bVar12 | bVar11)) {
      return true;
    }
    if (uVar3 <= (this->props).blend_operation_advanced.advancedBlendMaxColorAttachments) {
      if ((this->props).blend_operation_advanced.advancedBlendIndependentBlend != 0) {
        return true;
      }
      lVar10 = 0x38;
      uVar9 = 0;
      while( true ) {
        uVar9 = uVar9 + 1;
        bVar8 = uVar3 <= uVar9;
        if (bVar8) {
          return bVar8;
        }
        pVVar6 = info->pAttachments;
        if (*(VkBlendOp *)((long)&pVVar6->blendEnable + lVar10) != pVVar6->alphaBlendOp) break;
        lVar7 = lVar10 + -0xc;
        lVar10 = lVar10 + 0x20;
        if (*(VkBlendOp *)((long)pVVar6 + lVar7) != pVVar6->colorBlendOp) {
          return bVar8;
        }
      }
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::color_blend_state_is_supported(
		const VkPipelineColorBlendStateCreateInfo *info,
		const VkDynamicState *dynamic_states, uint32_t num_dynamic_states) const
{
	constexpr VkPipelineColorBlendStateCreateFlags supported_flags =
			VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT;

	if (info->flags & ~supported_flags)
		return false;

	if ((info->flags & VK_PIPELINE_COLOR_BLEND_STATE_CREATE_RASTERIZATION_ORDER_ATTACHMENT_ACCESS_BIT_EXT) != 0 &&
	    features.rasterization_order_attachment_access.rasterizationOrderColorAttachmentAccess == VK_FALSE)
		return false;

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_LOGIC_OP_ENABLE_EXT) &&
	    info->logicOpEnable && !features2.features.logicOp)
	{
		return false;
	}

	if (!has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_EQUATION_EXT) &&
	    !has_dynamic_state(dynamic_states, num_dynamic_states, VK_DYNAMIC_STATE_COLOR_BLEND_ADVANCED_EXT))
	{
		bool has_advanced_color_blend = false;
		bool has_advanced_alpha_blend = false;

		for (uint32_t i = 0; i < info->attachmentCount; i++)
		{
			auto &att = info->pAttachments[i];

			bool advanced_color = blend_op_is_advanced(att.colorBlendOp);
			bool advanced_alpha = blend_op_is_advanced(att.alphaBlendOp);
			has_advanced_color_blend = has_advanced_color_blend || advanced_color;
			has_advanced_alpha_blend = has_advanced_alpha_blend || advanced_alpha;

			if (advanced_color || advanced_alpha)
			{
				if (att.alphaBlendOp != att.colorBlendOp)
					return false;
				if (!props.blend_operation_advanced.advancedBlendAllOperations)
					return false;
			}
		}

		if (has_advanced_color_blend || has_advanced_alpha_blend)
		{
			if (info->attachmentCount > props.blend_operation_advanced.advancedBlendMaxColorAttachments)
				return false;

			if (!props.blend_operation_advanced.advancedBlendIndependentBlend)
			{
				for (uint32_t i = 1; i < info->attachmentCount; i++)
				{
					if (info->pAttachments[i].alphaBlendOp != info->pAttachments[0].alphaBlendOp)
						return false;
					if (info->pAttachments[i].colorBlendOp != info->pAttachments[0].colorBlendOp)
						return false;
				}
			}
		}
	}

	return true;
}